

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O3

ps_seg_t * allphone_search_seg_iter(ps_search_t *search)

{
  long lVar1;
  ps_segfuncs_t *ppVar2;
  _func_ps_seg_t_ptr_ps_seg_t_ptr *p_Var3;
  undefined8 uVar4;
  ps_seg_t *ppVar5;
  char *pcVar6;
  
  ppVar5 = (ps_seg_t *)0x0;
  allphone_backtrace((allphone_search_t *)search,*(int *)&search[1].d2p + -1,(int32 *)0x0);
  lVar1._0_4_ = search[1].post;
  lVar1._4_4_ = search[1].n_words;
  if (lVar1 != 0) {
    ppVar5 = (ps_seg_t *)
             __ckd_calloc__(1,0x40,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                            ,0x7a);
    ppVar5->vt = &fsg_segfuncs;
    ppVar5->search = search;
    ppVar2 = *(ps_segfuncs_t **)&search[1].post;
    ppVar5[1].vt = ppVar2;
    p_Var3 = ppVar2->seg_next;
    uVar4 = *(undefined8 *)(p_Var3 + 4);
    ppVar5->sf = (int)uVar4;
    ppVar5->ef = (int)((ulong)uVar4 >> 0x20);
    uVar4 = *(undefined8 *)(p_Var3 + 0xc);
    ppVar5->ascr = (int)uVar4;
    ppVar5->lscr = (int)((ulong)uVar4 >> 0x20);
    pcVar6 = bin_mdef_ciphone_str(search->acmod->mdef,(int)*(short *)p_Var3);
    ppVar5->text = pcVar6;
    ppVar5->wid = -1;
  }
  return ppVar5;
}

Assistant:

static ps_seg_t *
allphone_search_seg_iter(ps_search_t * search)
{
    allphone_search_t *allphs = (allphone_search_t *) search;
    phseg_iter_t *iter;

    allphone_backtrace(allphs, allphs->frame - 1, NULL);
    if (allphs->segments == NULL)
        return NULL;
    
    iter = ckd_calloc(1, sizeof(phseg_iter_t));

    iter->base.vt = &fsg_segfuncs;
    iter->base.search = search;
    iter->seg = allphs->segments;
    allphone_search_fill_iter((ps_seg_t *)iter, gnode_ptr(iter->seg));

    return (ps_seg_t *) iter;
}